

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O2

DataGroup __thiscall
DL::DataLisp_Internal::buildGroup(DataLisp_Internal *this,StatementNode *n,VM *vm)

{
  SourceLogger *pSVar1;
  VM *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  SourceLogger *pSVar3;
  DataGroup DVar4;
  Data data;
  Data local_90;
  
  if (vm != (VM *)0x0) {
    DataGroup::DataGroup((DataGroup *)this,(string_t *)vm);
    pSVar1 = vm[2].mLogger;
    _Var2._M_pi = extraout_RDX;
    for (pSVar3 = (SourceLogger *)vm[2].mContainer; pSVar3 != pSVar1;
        pSVar3 = (SourceLogger *)&pSVar3->mWarningCount) {
      buildData(&local_90,(DataLisp_Internal *)n,
                (DataNode *)
                (((vector_t<DataGroup> *)&pSVar3->_vptr_SourceLogger)->
                super__Vector_base<DL::DataGroup,_std::allocator<DL::DataGroup>_>)._M_impl.
                super__Vector_impl_data._M_start,in_RCX);
      if (local_90.mType != DT_None) {
        DataGroup::add((DataGroup *)this,&local_90);
      }
      Data::~Data(&local_90);
      _Var2._M_pi = extraout_RDX_00;
    }
    DVar4.mShared.super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var2._M_pi;
    DVar4.mShared.super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (DataGroup)DVar4.mShared.super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __assert_fail("(n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/DataLisp.cpp"
                ,0x112,"DataGroup DL::DataLisp_Internal::buildGroup(StatementNode *, VM &)");
}

Assistant:

DataGroup buildGroup(StatementNode* n, VM& vm)
	{
		DL_ASSERT(n);

		DataGroup group(n->Name);
		for (DataNode* ptr : n->Nodes) {
			Data data = buildData(ptr, vm);
			if (data.isValid())
				group.add(data);
		}

		return group;
	}